

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

optional<unsigned_int>
google::protobuf::internal::anon_unknown_0::GetEndGroupTag(Descriptor *descriptor)

{
  int iVar1;
  Type TVar2;
  int iVar3;
  Descriptor *pDVar4;
  uint32_t local_34;
  FieldDescriptor *local_30;
  FieldDescriptor *field;
  int i;
  Descriptor *parent;
  Descriptor *descriptor_local;
  
  parent = descriptor;
  _i = Descriptor::containing_type(descriptor);
  if (_i == (Descriptor *)0x0) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&descriptor_local);
  }
  else {
    for (field._0_4_ = 0; iVar3 = (int)field, iVar1 = Descriptor::field_count(_i), iVar3 < iVar1;
        field._0_4_ = (int)field + 1) {
      local_30 = Descriptor::field(_i,(int)field);
      TVar2 = FieldDescriptor::type(local_30);
      if ((TVar2 == TYPE_GROUP) &&
         (pDVar4 = FieldDescriptor::message_type(local_30), pDVar4 == parent)) {
        iVar3 = FieldDescriptor::number(local_30);
        local_34 = WireFormatLite::MakeTag(iVar3,WIRETYPE_END_GROUP);
        std::optional<unsigned_int>::optional<unsigned_int,_true>
                  ((optional<unsigned_int> *)&descriptor_local,&local_34);
        return (_Optional_base<unsigned_int,_true,_true>)
               (_Optional_base<unsigned_int,_true,_true>)descriptor_local;
      }
    }
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&descriptor_local);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)descriptor_local;
}

Assistant:

absl::optional<uint32_t> GetEndGroupTag(const Descriptor* descriptor) {
  auto* parent = descriptor->containing_type();
  if (parent == nullptr) return absl::nullopt;
  for (int i = 0; i < parent->field_count(); ++i) {
    auto* field = parent->field(i);
    if (field->type() == field->TYPE_GROUP &&
        field->message_type() == descriptor) {
      return WireFormatLite::MakeTag(field->number(),
                                     WireFormatLite::WIRETYPE_END_GROUP);
    }
  }
  return absl::nullopt;
}